

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O0

uint __thiscall
ON_SubDMeshFragment::GetFaceFragments
          (ON_SubDMeshFragment *this,ON_SimpleArray<const_ON_SubDMeshFragment_*> *fragments)

{
  uint uVar1;
  ON_SubDMeshFragment **fragments_00;
  uint fragment_count;
  ON_SimpleArray<const_ON_SubDMeshFragment_*> *fragments_local;
  ON_SubDMeshFragment *this_local;
  
  uVar1 = FaceFragmentCount(this);
  ON_SimpleArray<const_ON_SubDMeshFragment_*>::SetCount(fragments,0);
  ON_SimpleArray<const_ON_SubDMeshFragment_*>::Reserve(fragments,(ulong)uVar1);
  fragments_00 = ON_SimpleArray<const_ON_SubDMeshFragment_*>::Array(fragments);
  uVar1 = GetFaceFragments(this,fragments_00,(ulong)uVar1);
  ON_SimpleArray<const_ON_SubDMeshFragment_*>::SetCapacity(fragments,(ulong)uVar1);
  return uVar1;
}

Assistant:

unsigned int ON_SubDMeshFragment::GetFaceFragments(
  ON_SimpleArray<const ON_SubDMeshFragment*>& fragments
) const
{
  unsigned int fragment_count = FaceFragmentCount();
  fragments.SetCount(0);
  fragments.Reserve(fragment_count);
  fragment_count = GetFaceFragments(fragments.Array(), fragment_count);
  fragments.SetCapacity(fragment_count);
  return fragment_count;
}